

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Al.cpp
# Opt level: O3

void Al::Finalize(void)

{
  ProgressEngine *pPVar1;
  
  if ((anonymous_namespace)::is_initialized == '\x01') {
    internal::ProgressEngine::stop((anonymous_namespace)::progress_engine);
    pPVar1 = (anonymous_namespace)::progress_engine;
    if ((anonymous_namespace)::progress_engine != (ProgressEngine *)0x0) {
      internal::ProgressEngine::~ProgressEngine((anonymous_namespace)::progress_engine);
    }
    operator_delete(pPVar1,0x8100,0x80);
    (anonymous_namespace)::progress_engine = (ProgressEngine *)0x0;
    internal::
    CachingAllocator<(Al::internal::MemoryType)0,_Al::internal::HostMemoryAllocator,_Al::internal::CachingAllocatorDefaultParams>
    ::clear((CachingAllocator<(Al::internal::MemoryType)0,_Al::internal::HostMemoryAllocator,_Al::internal::CachingAllocatorDefaultParams>
             *)internal::mempool);
    (anonymous_namespace)::is_initialized = 0;
    internal::mpi::finalize();
    internal::trace::write_trace_to_file();
    return;
  }
  return;
}

Assistant:

void Finalize() {
  // Make calling Finalize multiple times safely.
  if (!is_initialized) {
    return;
  }
  // Finalize in reverse order of initialization.
#ifdef AL_HAS_HOST_TRANSFER
  internal::ht::finalize();
#endif
#ifdef AL_HAS_MPI_CUDA
  internal::mpi_cuda::finalize();
#endif
#ifdef AL_HAS_NCCL
  internal::nccl::finalize();
#endif
#ifdef AL_HAS_CUDA
  internal::cuda::finalize();
#endif
  progress_engine->stop();
  delete progress_engine;
  progress_engine = nullptr;
  // Clear host memory pool.
  internal::mempool.clear();
  is_initialized = false;
  internal::mpi::finalize();
  internal::trace::write_trace_to_file();
}